

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

idx_t __thiscall duckdb::IEJoinGlobalSourceState::MaxThreads(IEJoinGlobalSourceState *this)

{
  pointer pGVar1;
  const_reference pvVar2;
  pointer pGVar3;
  idx_t iVar4;
  idx_t iVar5;
  
  pGVar1 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->op->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::get<true>((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                        *)(pGVar1 + 1),0);
  pGVar3 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->(pvVar2);
  iVar4 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(pGVar3);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
           ::get<true>((vector<duckdb::unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>,_true>
                        *)(pGVar1 + 1),1);
  pGVar3 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->(pvVar2);
  iVar5 = PhysicalRangeJoin::GlobalSortedTable::BlockCount(pGVar3);
  return iVar5 * iVar4;
}

Assistant:

idx_t MaxThreads() override {
		// We can't leverage any more threads than block pairs.
		const auto &sink_state = (op.sink_state->Cast<IEJoinGlobalState>());
		return sink_state.tables[0]->BlockCount() * sink_state.tables[1]->BlockCount();
	}